

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::genRunFunction_abi_cxx11_(CppGenerator *this,bool parallelize)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  size_type sVar5;
  vector<bool,_std::allocator<bool>_> *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_DL;
  long in_RSI;
  string *in_RDI;
  reference rVar7;
  size_t view;
  size_t group_2;
  size_t otherGroup;
  size_t *viewID;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t group_1;
  vector<bool,_std::allocator<bool>_> joinedGroups;
  size_t group;
  TDNode *node_2;
  size_t rel_2;
  TDNode *node_1;
  size_t rel_1;
  TDNode *node;
  size_t rel;
  string returnString;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffee08;
  TreeDecomposition *in_stack_ffffffffffffee10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee18;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffee20;
  _Bit_type *in_stack_ffffffffffffee28;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffee30;
  vector<bool,_std::allocator<bool>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee40;
  CppGenerator *in_stack_ffffffffffffee48;
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e40;
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  reference local_b98;
  vector<bool,_std::allocator<bool>_> *local_b88;
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  _Bit_reference local_a80;
  string local_a70 [32];
  string local_a50 [32];
  string local_a30 [32];
  string local_a10 [32];
  string local_9f0 [32];
  reference local_9d0;
  undefined8 local_9c0;
  reference local_9b8;
  unsigned_long *local_9b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9a8;
  long local_9a0;
  ulong local_998;
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  ulong local_8c0;
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  TDNode *local_598;
  ulong local_590;
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  TDNode *local_4c8;
  ulong local_4c0;
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  TDNode *local_438;
  ulong local_430;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_e8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_308);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_3e8);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_428);
  if ((local_11 & 1) == 0) {
    local_430 = 0;
    while( true ) {
      uVar1 = local_430;
      peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a1642);
      sVar4 = TreeDecomposition::numberOfRelations(peVar3);
      if (sVar4 <= uVar1) break;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2a167e);
      local_438 = TreeDecomposition::getRelation
                            (in_stack_ffffffffffffee10,(size_t)in_stack_ffffffffffffee08);
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::string::operator+=(local_38,local_458);
      std::__cxx11::string::~string(local_458);
      std::__cxx11::string::~string(local_478);
      std::__cxx11::string::~string(local_498);
      std::__cxx11::string::~string(local_4b8);
      local_430 = local_430 + 1;
    }
  }
  else {
    local_4c0 = 0;
    while( true ) {
      uVar1 = local_4c0;
      peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a1cdf);
      sVar4 = TreeDecomposition::numberOfRelations(peVar3);
      if (sVar4 <= uVar1) break;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2a1d1b);
      local_4c8 = TreeDecomposition::getRelation
                            (in_stack_ffffffffffffee10,(size_t)in_stack_ffffffffffffee08);
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::string::operator+=(local_38,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string(local_588);
      local_4c0 = local_4c0 + 1;
    }
    local_590 = 0;
    while( true ) {
      uVar1 = local_590;
      peVar3 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a1f7c);
      sVar4 = TreeDecomposition::numberOfRelations(peVar3);
      if (sVar4 <= uVar1) break;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2a1fb5);
      local_598 = TreeDecomposition::getRelation
                            (in_stack_ffffffffffffee10,(size_t)in_stack_ffffffffffffee08);
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee10);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::string::operator+=(local_38,local_5b8);
      std::__cxx11::string::~string(local_5b8);
      std::__cxx11::string::~string(local_5d8);
      std::__cxx11::string::~string(local_5f8);
      std::__cxx11::string::~string(local_618);
      local_590 = local_590 + 1;
    }
  }
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((char *)in_stack_ffffffffffffee18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_638);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_758);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_7d8);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_878);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  if ((local_11 & 1) == 0) {
    local_8c0 = 0;
    while( true ) {
      uVar1 = local_8c0;
      sVar5 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RSI + 0xf0));
      if (sVar5 <= uVar1) break;
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffee48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::string::operator+=(local_38,local_8e0);
      std::__cxx11::string::~string(local_8e0);
      std::__cxx11::string::~string(local_900);
      std::__cxx11::string::~string(local_960);
      std::__cxx11::string::~string(local_920);
      std::__cxx11::string::~string(local_940);
      local_8c0 = local_8c0 + 1;
    }
  }
  else {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)(in_RSI + 0xf0));
    std::allocator<bool>::allocator((allocator<bool> *)0x2a2a31);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_ffffffffffffee20,(size_type)in_stack_ffffffffffffee18,
               (allocator_type *)in_stack_ffffffffffffee10);
    std::allocator<bool>::~allocator((allocator<bool> *)0x2a2a57);
    local_998 = 0;
    while( true ) {
      uVar1 = local_998;
      sVar5 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)(in_RSI + 0xf0));
      rVar7._M_mask = (_Bit_type)in_stack_ffffffffffffee20;
      rVar7._M_p = in_stack_ffffffffffffee28;
      if (sVar5 <= uVar1) break;
      local_9a0 = *(long *)(in_RSI + 0xc0) + local_998 * 0x18;
      local_9a8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_ffffffffffffee08);
      local_9b0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (in_stack_ffffffffffffee08);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffee10,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffee08);
        if (!bVar2) break;
        local_9b8 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_9a8);
        local_9c0 = *(undefined8 *)(*(long *)(in_RSI + 0x118) + *local_9b8 * 8);
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28);
        in_stack_ffffffffffffee48 = (CppGenerator *)rVar7._M_mask;
        local_9d0 = rVar7;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_9d0);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
          std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
          std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffee48);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
          std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
          std::__cxx11::string::operator+=(local_38,local_9f0);
          std::__cxx11::string::~string(local_9f0);
          std::__cxx11::string::~string(local_a10);
          std::__cxx11::string::~string(local_a70);
          std::__cxx11::string::~string(local_a30);
          std::__cxx11::string::~string(local_a50);
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_ffffffffffffee30,(size_type)in_stack_ffffffffffffee28);
          local_a80._M_mask = rVar7._M_mask;
          in_stack_ffffffffffffee40 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar7._M_p;
          local_a80._M_p = (_Bit_type *)in_stack_ffffffffffffee40;
          std::_Bit_reference::operator=(&local_a80,true);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_9a8);
      }
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffee48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffee48);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
      std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
      std::__cxx11::string::operator+=(local_38,local_aa0);
      std::__cxx11::string::~string(local_aa0);
      std::__cxx11::string::~string(local_ac0);
      std::__cxx11::string::~string(local_b80);
      std::__cxx11::string::~string(local_ae0);
      std::__cxx11::string::~string(local_b00);
      std::__cxx11::string::~string(local_b60);
      std::__cxx11::string::~string(local_b20);
      std::__cxx11::string::~string(local_b40);
      local_998 = local_998 + 1;
    }
    local_b88 = (vector<bool,_std::allocator<bool>_> *)0x0;
    while( true ) {
      this_00 = local_b88;
      pvVar6 = (vector<bool,_std::allocator<bool>_> *)
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)(in_RSI + 0xf0));
      if (pvVar6 <= this_00) break;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)rVar7._M_p);
      local_b98 = rVar7;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_b98);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
        std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffee48);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
        std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
        std::__cxx11::string::operator+=(local_38,local_bb8);
        std::__cxx11::string::~string(local_bb8);
        std::__cxx11::string::~string(local_bd8);
        std::__cxx11::string::~string(local_c38);
        std::__cxx11::string::~string(local_bf8);
        std::__cxx11::string::~string(local_c18);
      }
      local_b88 = (vector<bool,_std::allocator<bool>_> *)
                  ((long)&(local_b88->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x2a32c8);
  }
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((char *)in_stack_ffffffffffffee18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_c58);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_c78);
  std::__cxx11::string::~string(local_df8);
  std::__cxx11::string::~string(local_c98);
  std::__cxx11::string::~string(local_cb8);
  std::__cxx11::string::~string(local_dd8);
  std::__cxx11::string::~string(local_cd8);
  std::__cxx11::string::~string(local_cf8);
  std::__cxx11::string::~string(local_d18);
  std::__cxx11::string::~string(local_db8);
  std::__cxx11::string::~string(local_d38);
  std::__cxx11::string::~string(local_d58);
  std::__cxx11::string::~string(local_d78);
  std::__cxx11::string::~string(local_d98);
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(in_stack_ffffffffffffee18,(char *)in_stack_ffffffffffffee10);
  std::__cxx11::string::operator+=(local_38,local_e18);
  std::__cxx11::string::~string(local_e18);
  std::__cxx11::string::~string(local_e38);
  local_e40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs = local_e40;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a35dd);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x2a35e5);
    if (__lhs <= __rhs) break;
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=(local_38,local_e60);
    std::__cxx11::string::~string(local_e60);
    std::__cxx11::string::~string(local_e80);
    std::__cxx11::string::~string(local_ea0);
    std::__cxx11::string::~string(local_ec0);
    std::__cxx11::string::~string(local_ee0);
    std::__cxx11::string::~string(local_f00);
    local_e40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_e40->field_0x1;
  }
  if ((*(byte *)(in_RSI + 0x2e8) & 1) == 0) {
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=(local_38,local_1060);
    std::__cxx11::string::~string(local_1060);
    std::__cxx11::string::~string(local_1080);
    std::__cxx11::string::~string(local_10e0);
    std::__cxx11::string::~string(local_10a0);
    std::__cxx11::string::~string(local_10c0);
  }
  else {
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=(local_38,local_f20);
    std::__cxx11::string::~string(local_f20);
    std::__cxx11::string::~string(local_f40);
    std::__cxx11::string::~string(local_f60);
    std::__cxx11::string::~string(local_fc0);
    std::__cxx11::string::~string(local_f80);
    std::__cxx11::string::~string(local_fa0);
    if ((multifaq::cppgen::BENCH_INDIVIDUAL & 1) != 0) {
      offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::operator+=(local_38,local_fe0);
      std::__cxx11::string::~string(local_fe0);
      std::__cxx11::string::~string(local_1000);
    }
    offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=(local_38,local_1020);
    std::__cxx11::string::~string(local_1020);
    std::__cxx11::string::~string(local_1040);
  }
  offset_abi_cxx11_(in_stack_ffffffffffffee48,(size_t)in_stack_ffffffffffffee40);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::~string(local_1100);
  std::__cxx11::string::~string(local_1120);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string CppGenerator::genRunFunction(bool parallelize)
{
    std::string returnString = offset(1)+"void run()\n"+
        offset(1)+"{\n";
    
    returnString += offset(2)+"int64_t startLoading = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"loadRelations();\n\n"+
        offset(2)+"int64_t loadTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startLoading;\n"+
        offset(2)+"std::cout << \"Data loading: \"+"+
        "std::to_string(loadTime)+\"ms.\\n\";\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << loadTime;\n"+
        offset(2)+"ofs.close();\n\n";
    
    returnString += offset(2)+"int64_t startSorting = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"();\n";
        }
    }
    else
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"std::thread sort"+node->_name+
                "Thread(sort"+node->_name+");\n";
        }

        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t sortingTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startSorting;\n"+
        offset(2)+"std::cout << \"Data sorting: \" + "+
        "std::to_string(sortingTime)+\"ms.\\n\";\n\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << sortingTime;\n"+
        offset(2)+"ofs.close();\n\n";

    returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t group = 0; group < viewGroups.size(); ++group)
            returnString += offset(2)+"computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        std::vector<bool> joinedGroups(viewGroups.size());
    
        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            for (const size_t& viewID : groupIncomingViews[group])
            {
                // find group that contains this view!
                size_t otherGroup = viewToGroupMapping[viewID];
                if (!joinedGroups[otherGroup])
                {
                    returnString += offset(2)+"group"+std::to_string(otherGroup)+
                        "Thread.join();\n";
                    joinedGroups[otherGroup] = 1;
                }
            }

            returnString += offset(2)+"std::thread group"+std::to_string(group)+
                    "Thread(computeGroup"+std::to_string(group)+");\n";            
        }

        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            if (!joinedGroups[group])
                returnString += offset(2)+"group"+std::to_string(group)+
                    "Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t processTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Data process: \"+"+
        "std::to_string(processTime)+\"ms.\\n\";\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << processTime;\n";
    
    // if (BENCH_INDIVIDUAL)    
    returnString += offset(2)+"std::cout << \"Size of each computed View: \" << std::endl;\n";
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {
        returnString += offset(2)+"std::cout << \""+viewName[view]+": \" << "+
            viewName[view]+".size() << std::endl;\n";
    }
    
    if (_hasApplicationHandler)
    {
        returnString += offset(2)+"ofs.close();\n\n"+
            offset(2)+"int64_t appProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

        if (BENCH_INDIVIDUAL)
            returnString += offset(2)+"std::cout << \"run Application:\\n\";\n";

        returnString += offset(2)+"runApplication();\n"; 
    }
    else {        
        returnString += offset(2)+"ofs << std::endl;\n"+
            offset(2)+"ofs.close();\n\n";
    }
    
    return returnString+offset(1)+"}\n";
}